

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

holder<cs::pointer> * __thiscall
cs::allocator_type<cs_impl::any::holder<cs::pointer>,64ul,cs_impl::default_allocator_provider>::
alloc<cs::pointer_const&>
          (allocator_type<cs_impl::any::holder<cs::pointer>,64ul,cs_impl::default_allocator_provider>
           *this,pointer *args)

{
  long lVar1;
  proxy *ppVar2;
  holder<cs::pointer> *phVar3;
  
  if ((*(long *)(this + 0x208) == 0) || (global_thread_counter != 0)) {
    phVar3 = (holder<cs::pointer> *)operator_new(0x10);
  }
  else {
    lVar1 = *(long *)(this + 0x208);
    *(long *)(this + 0x208) = lVar1 + -1;
    phVar3 = *(holder<cs::pointer> **)(this + lVar1 * 8 + -8);
  }
  (phVar3->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__holder_00249318;
  ppVar2 = (args->data).mDat;
  if (ppVar2 != (proxy *)0x0) {
    ppVar2->refcount = ppVar2->refcount + 1;
  }
  (phVar3->mDat).data.mDat = ppVar2;
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}